

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O0

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitStringEq(InternalAnalyzer *this,StringEq *curr)

{
  bool bVar1;
  StringEq *curr_local;
  InternalAnalyzer *this_local;
  
  if ((curr->op == StringEqCompare) &&
     ((bVar1 = wasm::Type::isNullable(&curr->left->type), bVar1 ||
      (bVar1 = wasm::Type::isNullable(&curr->right->type), bVar1)))) {
    this->parent->implicitTrap = true;
  }
  return;
}

Assistant:

void visitStringEq(StringEq* curr) {
      if (curr->op == StringEqCompare) {
        // traps when either input is null.
        if (curr->left->type.isNullable() || curr->right->type.isNullable()) {
          parent.implicitTrap = true;
        }
      }
    }